

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.h
# Opt level: O0

void __thiscall FxConstant::FxConstant(FxConstant *this,FName *val,FScriptPosition *pos)

{
  PName *pPVar1;
  int iVar2;
  FScriptPosition *pos_local;
  FName *val_local;
  FxConstant *this_local;
  
  FxExpression::FxExpression(&this->super_FxExpression,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_00b8a638;
  ExpVal::ExpVal(&this->value);
  pPVar1 = TypeName;
  (this->value).Type = (PType *)TypeName;
  (this->super_FxExpression).ValueType = (PType *)pPVar1;
  iVar2 = FName::operator_cast_to_int(val);
  (this->value).field_1.Int = iVar2;
  (this->super_FxExpression).isresolved = true;
  return;
}

Assistant:

FxConstant(FName val, const FScriptPosition &pos) : FxExpression(pos)
	{
		ValueType = value.Type = TypeName;
		value.Int = val;
		isresolved = true;
	}